

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O2

qint64 __thiscall QNetworkReplyFileImpl::bytesAvailable(QNetworkReplyFileImpl *this)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  qint64 qVar5;
  
  lVar4 = *(long *)(this + 8);
  if (*(char *)(lVar4 + 0x22c) == '\x01') {
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)(lVar4 + 0x238));
    if (bVar1) {
      cVar2 = QIODevice::isOpen();
      if (cVar2 != '\0') {
        lVar3 = QIODevice::bytesAvailable();
        lVar4 = (**(code **)(**(long **)(lVar4 + 0x240) + 0xa0))();
        return lVar4 + lVar3;
      }
    }
  }
  qVar5 = QIODevice::bytesAvailable();
  return qVar5;
}

Assistant:

qint64 QNetworkReplyFileImpl::bytesAvailable() const
{
    Q_D(const QNetworkReplyFileImpl);
    if (!d->isFinished || !d->realFile || !d->realFile->isOpen())
        return QNetworkReply::bytesAvailable();
    return QNetworkReply::bytesAvailable() + d->realFile->bytesAvailable();
}